

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  _Elt_pointer ppVVar1;
  Token *in_RDX;
  Reader *in_RSI;
  bool bVar2;
  UInt digit;
  Char c;
  LargestUInt value;
  LargestUInt threshold;
  LargestUInt maxIntegerValue;
  bool isNegative;
  Location current;
  Location inspect;
  bool isDouble;
  Value *in_stack_fffffffffffffe58;
  Value *pVVar3;
  Value *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Value *in_stack_fffffffffffffe90;
  ulong local_168;
  bool local_15a;
  bool local_159;
  Location in_stack_fffffffffffffeb8;
  Token *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  Reader *in_stack_fffffffffffffed0;
  Value local_128;
  Value local_100;
  uint local_d8;
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [39];
  char local_59;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined1 local_39;
  _Elt_pointer local_38;
  _Elt_pointer local_30;
  uint7 in_stack_ffffffffffffffd8;
  bool local_1;
  
  local_159 = false;
  for (local_30 = (_Elt_pointer)
                  (in_RSI->nodes_).c.
                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                  super__Deque_impl_data._M_map_size;
      local_30 !=
      (in_RSI->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur; local_30 = (_Elt_pointer)((long)local_30 + 1)) {
    bVar2 = local_159 == false;
    local_159 = true;
    if (bVar2) {
      bVar2 = in(*(Char *)local_30,'.','e','E','+');
      local_159 = true;
      if (!bVar2) {
        local_15a = false;
        if (*(char *)local_30 == '-') {
          local_15a = local_30 !=
                      (_Elt_pointer)
                      (in_RSI->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_map_size;
        }
        local_159 = local_15a;
      }
    }
  }
  if (local_159 == false) {
    local_38 = (_Elt_pointer)
               (in_RSI->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_map_size;
    local_39 = *(char *)local_38 == '-';
    if ((bool)local_39) {
      local_38 = (_Elt_pointer)((long)local_38 + 1);
      local_168 = 0x8000000000000000;
    }
    else {
      local_168 = 0xffffffffffffffff;
    }
    local_48 = local_168;
    local_50 = local_168 / 10;
    local_58 = 0;
    while (local_38 <
           (in_RSI->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVVar1 = (_Elt_pointer)((long)local_38 + 1);
      local_59 = *(char *)local_38;
      local_38 = ppVVar1;
      if ((local_59 < '0') || ('9' < local_59)) {
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (in_RSI->nodes_).c.
                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                  super__Deque_impl_data._M_map_size;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  (this_00,(char *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe70,(allocator<char> *)in_stack_fffffffffffffe68);
        std::operator+((char *)in_stack_fffffffffffffe68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60);
        std::operator+(in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
        bVar2 = addError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string(local_a0);
        std::__cxx11::string::~string(local_c0);
        std::allocator<char>::~allocator(&local_c1);
        return bVar2;
      }
      local_d8 = (int)local_59 - 0x30;
      if ((local_50 <= local_58) &&
         (((local_50 < local_58 ||
           (ppVVar1 !=
            (in_RSI->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur)) ||
          (in_stack_fffffffffffffe70 = (char *)(ulong)local_d8,
          (char *)(local_168 % 10) < in_stack_fffffffffffffe70)))) {
        bVar2 = decodeDouble(in_RSI,in_RDX,(Value *)(ulong)in_stack_ffffffffffffffd8);
        return bVar2;
      }
      local_58 = local_58 * 10 + (ulong)local_d8;
    }
    if ((bool)local_39) {
      Value::Value(&local_100,-local_58);
      Value::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      Value::~Value(in_stack_fffffffffffffe90);
    }
    else if (local_58 < 0x80000000) {
      pVVar3 = &local_128;
      Value::Value(pVVar3,local_58);
      Value::operator=(pVVar3,in_stack_fffffffffffffe58);
      Value::~Value(in_stack_fffffffffffffe90);
    }
    else {
      pVVar3 = (Value *)&stack0xfffffffffffffeb0;
      Value::Value(pVVar3,local_58);
      Value::operator=(in_stack_fffffffffffffe60,pVVar3);
      Value::~Value(in_stack_fffffffffffffe90);
    }
    local_1 = true;
  }
  else {
    local_1 = decodeDouble(in_RSI,in_RDX,(Value *)CONCAT17(local_159,in_stack_ffffffffffffffd8));
  }
  return local_1;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}